

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_sqlite.cpp
# Opt level: O0

sqlite3_value * duckdb::CastToSQLiteValue::OperationNull(void)

{
  sqlite3_value *in_RDI;
  sqlite3_value *sqlite_null;
  
  sqlite3_value::sqlite3_value((sqlite3_value *)0x222c10);
  in_RDI->type = NULL_VALUE;
  (in_RDI->u).r = 0.0;
  (in_RDI->u).r = 0.0;
  return in_RDI;
}

Assistant:

sqlite3_value CastToSQLiteValue::OperationNull() {
	sqlite3_value sqlite_null;
	sqlite_null.type = SQLiteTypeValue::NULL_VALUE;
	sqlite_null.u.i = 0;
	sqlite_null.u.r = 0.0;
	return sqlite_null;
}